

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

void write_action(Context *ctx,Var obj,ActionPtr *action)

{
  bool bVar1;
  ActionType AVar2;
  Var value;
  pointer pAVar3;
  InvokeAction *pIVar4;
  InvokeAction *iaction;
  Var actionObj;
  ActionPtr *action_local;
  Var obj_local;
  Context *ctx_local;
  
  value = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  set_property(ctx,obj,1,value,"Unable to set action");
  pAVar3 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->(action);
  bVar1 = wabt::Var::is_name(&pAVar3->module_var);
  if (bVar1) {
    pAVar3 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->(action);
    write_var(ctx,value,9,&pAVar3->module_var);
  }
  pAVar3 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->(action);
  AVar2 = wabt::Action::type(pAVar3);
  if (AVar2 == Invoke) {
    pAVar3 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::get(action);
    pIVar4 = wabt::cast<wabt::InvokeAction,wabt::Action>(pAVar3);
    write_string(ctx,value,0xb,"invoke",0xffffffff);
    write_string(ctx,value,6,&(pIVar4->super_ActionMixin<(wabt::ActionType)0>).super_Action.name);
    write_const_vector(ctx,value,2,&pIVar4->args);
  }
  else {
    pAVar3 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->(action);
    AVar2 = wabt::Action::type(pAVar3);
    if (AVar2 != Get) {
      __assert_fail("action->type() == ActionType::Get",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,0x113,"void write_action(Context *, Js::Var, const ActionPtr &)");
    }
    write_string(ctx,value,0xb,"get",0xffffffff);
    pAVar3 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->(action);
    write_string(ctx,value,6,&pAVar3->name);
  }
  return;
}

Assistant:

void write_action(Context* ctx, Js::Var obj, const ActionPtr& action)
{
    Js::Var actionObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    set_property(ctx, obj, PropertyIds::action, actionObj, "Unable to set action");

    if (action->module_var.is_name())
    {
        write_var(ctx, actionObj, PropertyIds::module, &action->module_var);
    }
    if (action->type() == ActionType::Invoke)
    {
        const InvokeAction* iaction = cast<InvokeAction>(action.get());
        write_string(ctx, actionObj, PropertyIds::type, "invoke");
        write_string(ctx, actionObj, PropertyIds::field, iaction->name);
        write_const_vector(ctx, actionObj, PropertyIds::args, iaction->args);
    }
    else
    {
        assert(action->type() == ActionType::Get);
        write_string(ctx, actionObj, PropertyIds::type, "get");
        write_string(ctx, actionObj, PropertyIds::field, action->name);
    }
}